

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threefish256Block.c
# Opt level: O0

void threefishDecrypt256(ThreefishKey_t *keyCtx,uint64_t *input,uint64_t *output)

{
  u64b_t uVar1;
  u64b_t uVar2;
  u64b_t uVar3;
  u64b_t uVar4;
  u64b_t uVar5;
  u64b_t uVar6;
  u64b_t uVar7;
  u64b_t uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t tmp;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  uint64_t k4;
  uint64_t k3;
  uint64_t k2;
  uint64_t k1;
  uint64_t k0;
  uint64_t b3;
  uint64_t b2;
  uint64_t b1;
  uint64_t b0;
  uint64_t *output_local;
  uint64_t *input_local;
  ThreefishKey_t *keyCtx_local;
  
  uVar1 = keyCtx->key[0];
  uVar2 = keyCtx->key[1];
  uVar3 = keyCtx->key[2];
  uVar4 = keyCtx->key[3];
  uVar5 = keyCtx->key[4];
  uVar6 = keyCtx->tweak[0];
  uVar7 = keyCtx->tweak[1];
  uVar8 = keyCtx->tweak[2];
  uVar9 = input[2] - (uVar1 + uVar7);
  uVar10 = input[3] - (uVar2 + 0x12) ^ *input - uVar4;
  uVar11 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar12 = (*input - uVar4) - uVar11;
  uVar10 = input[1] - (uVar5 + uVar6) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar3);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar5 + uVar6);
  uVar11 = uVar11 - (uVar1 + 0x11) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar4 + uVar8) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar12 = uVar12 - (uVar10 + uVar2);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  uVar9 = uVar9 - (uVar11 + uVar4 + uVar8);
  uVar11 = uVar11 - (uVar5 + 0x10) ^ uVar12;
  uVar11 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar3 + uVar7) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar1);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar3 + uVar7);
  uVar11 = uVar11 - (uVar4 + 0xf) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar2 + uVar6) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar12 = uVar12 - (uVar10 + uVar5);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  uVar9 = uVar9 - (uVar11 + uVar2 + uVar6);
  uVar11 = uVar11 - (uVar3 + 0xe) ^ uVar12;
  uVar11 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar1 + uVar8) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar4);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar1 + uVar8);
  uVar11 = uVar11 - (uVar2 + 0xd) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar5 + uVar7) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar12 = uVar12 - (uVar10 + uVar3);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  uVar9 = uVar9 - (uVar11 + uVar5 + uVar7);
  uVar11 = uVar11 - (uVar1 + 0xc) ^ uVar12;
  uVar11 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar4 + uVar6) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar2);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar4 + uVar6);
  uVar11 = uVar11 - (uVar5 + 0xb) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar3 + uVar8) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar12 = uVar12 - (uVar10 + uVar1);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  uVar9 = uVar9 - (uVar11 + uVar3 + uVar8);
  uVar11 = uVar11 - (uVar4 + 10) ^ uVar12;
  uVar11 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar2 + uVar7) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar5);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar2 + uVar7);
  uVar11 = uVar11 - (uVar3 + 9) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar1 + uVar6) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar12 = uVar12 - (uVar10 + uVar4);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  uVar9 = uVar9 - (uVar11 + uVar1 + uVar6);
  uVar11 = uVar11 - (uVar2 + 8) ^ uVar12;
  uVar11 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar5 + uVar8) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar3);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar5 + uVar8);
  uVar11 = uVar11 - (uVar1 + 7) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar4 + uVar7) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar12 = uVar12 - (uVar10 + uVar2);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  uVar9 = uVar9 - (uVar11 + uVar4 + uVar7);
  uVar11 = uVar11 - (uVar5 + 6) ^ uVar12;
  uVar11 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar3 + uVar6) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar1);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar3 + uVar6);
  uVar11 = uVar11 - (uVar4 + 5) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar2 + uVar8) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar12 = uVar12 - (uVar10 + uVar5);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  uVar9 = uVar9 - (uVar11 + uVar2 + uVar8);
  uVar11 = uVar11 - (uVar3 + 4) ^ uVar12;
  uVar11 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar1 + uVar7) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar4);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar1 + uVar7);
  uVar11 = uVar11 - (uVar2 + 3) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar5 + uVar6) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar12 = uVar12 - (uVar10 + uVar3);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  uVar9 = uVar9 - (uVar11 + uVar5 + uVar6);
  uVar11 = uVar11 - (uVar1 + 2) ^ uVar12;
  uVar11 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar4 + uVar8) ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x3a | uVar10 << 6;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x16 | uVar11 << 0x2a;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x2e | uVar10 << 0x12;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0xc | uVar13 << 0x34;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0x19 | uVar10 << 0x27;
  uVar12 = uVar12 - (uVar10 + uVar2);
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x21 | uVar11 << 0x1f;
  uVar9 = uVar9 - (uVar11 + uVar4 + uVar8);
  uVar11 = uVar11 - (uVar5 + 1) ^ uVar12;
  uVar11 = uVar11 >> 5 | uVar11 << 0x3b;
  uVar12 = uVar12 - uVar11;
  uVar10 = uVar10 - (uVar3 + uVar7) ^ uVar9;
  uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar13 = uVar10 >> 0x17 | uVar10 << 0x29;
  uVar12 = uVar12 - uVar13;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 >> 0x28 | uVar11 << 0x18;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar11 = uVar10 >> 0x34 | uVar10 << 0xc;
  uVar12 = uVar12 - uVar11;
  uVar13 = uVar13 ^ uVar9;
  uVar10 = uVar13 >> 0x39 | uVar13 << 7;
  uVar9 = uVar9 - uVar10;
  uVar10 = uVar10 ^ uVar12;
  uVar10 = uVar10 >> 0xe | uVar10 << 0x32;
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 >> 0x10 | uVar11 << 0x30;
  *output = uVar12 - (uVar10 + uVar1);
  output[1] = uVar10 - (uVar2 + uVar6);
  output[2] = uVar9 - (uVar11 + uVar3 + uVar7);
  output[3] = uVar11 - uVar4;
  return;
}

Assistant:

void threefishDecrypt256(ThreefishKey_t* keyCtx, uint64_t* input, uint64_t* output)
  {
    uint64_t b0 = input[0], b1 = input[1],
      b2 = input[2], b3 = input[3];
    uint64_t k0 = keyCtx->key[0], k1 = keyCtx->key[1],
      k2 = keyCtx->key[2], k3 = keyCtx->key[3],
      k4 = keyCtx->key[4];
    uint64_t t0 = keyCtx->tweak[0], t1 = keyCtx->tweak[1],
      t2 = keyCtx->tweak[2];

    uint64_t tmp;

    b0 -= k3;
    b1 -= k4 + t0;
    b2 -= k0 + t1;
    b3 -= k1 + 18;
    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k2; b1 -= k3 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k4 + t0; b3 -= k0 + 17;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k1; b1 -= k2 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k3 + t2; b3 -= k4 + 16;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k0; b1 -= k1 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k2 + t1; b3 -= k3 + 15;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k4; b1 -= k0 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k1 + t0; b3 -= k2 + 14;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k3; b1 -= k4 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k0 + t2; b3 -= k1 + 13;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k2; b1 -= k3 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k4 + t1; b3 -= k0 + 12;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k1; b1 -= k2 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k3 + t0; b3 -= k4 + 11;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k0; b1 -= k1 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k2 + t2; b3 -= k3 + 10;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k4; b1 -= k0 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k1 + t1; b3 -= k2 + 9;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k3; b1 -= k4 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k0 + t0; b3 -= k1 + 8;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k2; b1 -= k3 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k4 + t2; b3 -= k0 + 7;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k1; b1 -= k2 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k3 + t1; b3 -= k4 + 6;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k0; b1 -= k1 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k2 + t0; b3 -= k3 + 5;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k4; b1 -= k0 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k1 + t2; b3 -= k2 + 4;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k3; b1 -= k4 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k0 + t1; b3 -= k1 + 3;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k2; b1 -= k3 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k4 + t0; b3 -= k0 + 2;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k1; b1 -= k2 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k3 + t2; b3 -= k4 + 1;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k0; b1 -= k1 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k2 + t1; b3 -= k3;

    output[0] = b0;
    output[1] = b1;
    output[2] = b2;
    output[3] = b3;
  }